

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdh.c
# Opt level: O2

int mbedtls_ecdh_calc_secret
              (mbedtls_ecdh_context *ctx,size_t *olen,uchar *buf,size_t blen,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  mbedtls_mpi *z;
  ulong uVar1;
  int iVar2;
  size_t sVar3;
  
  iVar2 = -0x4f80;
  if (ctx != (mbedtls_ecdh_context *)0x0) {
    z = &ctx->z;
    iVar2 = mbedtls_ecdh_compute_shared(&ctx->grp,z,&ctx->Qp,&ctx->d,f_rng,p_rng);
    if (iVar2 == 0) {
      sVar3 = mbedtls_mpi_size(z);
      iVar2 = -0x4f80;
      if (sVar3 <= blen) {
        uVar1 = (ctx->grp).pbits;
        sVar3 = ((uVar1 >> 3) + 1) - (ulong)((uVar1 & 7) == 0);
        *olen = sVar3;
        iVar2 = mbedtls_mpi_write_binary(z,buf,sVar3);
        return iVar2;
      }
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_ecdh_calc_secret( mbedtls_ecdh_context *ctx, size_t *olen,
                      unsigned char *buf, size_t blen,
                      int (*f_rng)(void *, unsigned char *, size_t),
                      void *p_rng )
{
    int ret;

    if( ctx == NULL )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    if( ( ret = mbedtls_ecdh_compute_shared( &ctx->grp, &ctx->z, &ctx->Qp, &ctx->d,
                                     f_rng, p_rng ) ) != 0 )
    {
        return( ret );
    }

    if( mbedtls_mpi_size( &ctx->z ) > blen )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    *olen = ctx->grp.pbits / 8 + ( ( ctx->grp.pbits % 8 ) != 0 );
    return mbedtls_mpi_write_binary( &ctx->z, buf, *olen );
}